

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_sse3.hpp
# Opt level: O0

float xsimd::kernel::reduce_add<xsimd::sse4_2>
                (batch<float,_xsimd::sse4_2> *self,requires_arch<sse3> param_2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 in_XMM0_Qb;
  undefined8 uVar3;
  register_type afVar4;
  register_type afVar5;
  __m128 tmp1;
  __m128 tmp0;
  requires_arch<sse3> param_1_local;
  batch<float,_xsimd::sse4_2> *self_local;
  undefined4 local_18;
  
  afVar4 = types::simd_register::operator_cast_to_function_pointer((simd_register *)self);
  uVar3 = in_XMM0_Qb;
  afVar5 = types::simd_register::operator_cast_to_function_pointer((simd_register *)self);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = afVar4._0_8_;
  auVar1._8_8_ = uVar3;
  auVar1._0_8_ = afVar5._0_8_;
  auVar1 = vhaddps_avx(auVar2,auVar1);
  auVar1 = vhaddps_avx(auVar1,auVar1);
  local_18 = auVar1._0_4_;
  return local_18;
}

Assistant:

inline float reduce_add(batch<float, A> const& self, requires_arch<sse3>) noexcept
        {
            __m128 tmp0 = _mm_hadd_ps(self, self);
            __m128 tmp1 = _mm_hadd_ps(tmp0, tmp0);
            return _mm_cvtss_f32(tmp1);
        }